

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5PoslistNext64(u8 *a,int n,int *pi,i64 *piOff)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long in_FS_OFFSET;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = *pi;
  if (n <= iVar5) {
LAB_001c5d15:
    *piOff = -1;
    iVar5 = 1;
    goto LAB_001c5d5c;
  }
  uVar4 = *piOff;
  local_3c = (uint)a[iVar5];
  if ((char)a[iVar5] < '\0') {
    iVar2 = sqlite3Fts5GetVarint32(a + iVar5,&local_3c);
  }
  else {
    iVar2 = 1;
  }
  iVar5 = iVar5 + iVar2;
  if (local_3c < 2) {
    if (local_3c != 0) {
      bVar1 = a[iVar5];
      uVar4 = (ulong)bVar1;
      local_3c = (uint)bVar1;
      iVar3 = 1;
      iVar2 = iVar3;
      if ((char)bVar1 < '\0') {
        iVar2 = sqlite3Fts5GetVarint32(a + iVar5,&local_3c);
        uVar4 = (ulong)local_3c;
      }
      iVar2 = iVar2 + iVar5;
      local_3c = (uint)a[iVar2];
      if ((char)a[iVar2] < '\0') {
        iVar3 = sqlite3Fts5GetVarint32(a + iVar2,&local_3c);
      }
      if (local_3c < 2) goto LAB_001c5d15;
      iVar5 = iVar3 + iVar2;
      uVar4 = (ulong)(local_3c + 0x7ffffffe & 0x7fffffff) | uVar4 << 0x20;
      goto LAB_001c5d54;
    }
  }
  else {
    uVar4 = (ulong)(local_3c + (int)uVar4 + 0x7ffffffe & 0x7fffffff) | uVar4 & 0x7fffffff00000000;
LAB_001c5d54:
    *piOff = uVar4;
  }
  *pi = iVar5;
  iVar5 = 0;
LAB_001c5d5c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5PoslistNext64(
  const u8 *a, int n,             /* Buffer containing poslist */
  int *pi,                        /* IN/OUT: Offset within a[] */
  i64 *piOff                      /* IN/OUT: Current offset */
){
  int i = *pi;
  assert( a!=0 || i==0 );
  if( i>=n ){
    /* EOF */
    *piOff = -1;
    return 1;
  }else{
    i64 iOff = *piOff;
    u32 iVal;
    assert( a!=0 );
    fts5FastGetVarint32(a, i, iVal);
    if( iVal<=1 ){
      if( iVal==0 ){
        *pi = i;
        return 0;
      }
      fts5FastGetVarint32(a, i, iVal);
      iOff = ((i64)iVal) << 32;
      assert( iOff>=0 );
      fts5FastGetVarint32(a, i, iVal);
      if( iVal<2 ){
        /* This is a corrupt record. So stop parsing it here. */
        *piOff = -1;
        return 1;
      }
      *piOff = iOff + ((iVal-2) & 0x7FFFFFFF);
    }else{
      *piOff = (iOff & (i64)0x7FFFFFFF<<32)+((iOff + (iVal-2)) & 0x7FFFFFFF);
    }
    *pi = i;
    assert_nc( *piOff>=iOff );
    return 0;
  }
}